

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# min_max_operations.c
# Opt level: O0

int32_t WebRtcSpl_MaxAbsValueW32C(int32_t *vector,size_t length)

{
  uint uVar1;
  uint local_2c;
  ulong local_28;
  size_t i;
  uint32_t maximum;
  uint32_t absolute;
  size_t length_local;
  int32_t *vector_local;
  
  i._0_4_ = 0;
  if (length != 0) {
    for (local_28 = 0; local_28 < length; local_28 = local_28 + 1) {
      uVar1 = vector[local_28];
      if ((int)uVar1 < 1) {
        uVar1 = -uVar1;
      }
      if ((uint)i < uVar1) {
        i._0_4_ = uVar1;
      }
    }
    if ((uint)i < 0x7fffffff) {
      local_2c = (uint)i;
    }
    else {
      local_2c = 0x7fffffff;
    }
    return local_2c;
  }
  __assert_fail("length > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/signal_processing/min_max_operations.c"
                ,0x43,"int32_t WebRtcSpl_MaxAbsValueW32C(const int32_t *, size_t)");
}

Assistant:

int32_t WebRtcSpl_MaxAbsValueW32C(const int32_t* vector, size_t length) {
  // Use uint32_t for the local variables, to accommodate the return value
  // of abs(0x80000000), which is 0x80000000.

  uint32_t absolute = 0, maximum = 0;
  size_t i = 0;

  assert(length > 0);

  for (i = 0; i < length; i++) {
    absolute = abs((int)vector[i]);
    if (absolute > maximum) {
      maximum = absolute;
    }
  }

  maximum = WEBRTC_SPL_MIN(maximum, WEBRTC_SPL_WORD32_MAX);

  return (int32_t)maximum;
}